

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::clara::TextFlow::Column::iterator::addIndentAndSuffix
          (string *__return_storage_ptr__,iterator *this,string *plain)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator local_41;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *plain_local;
  iterator *this_local;
  
  local_20 = plain;
  plain_local = (string *)this;
  this_local = (iterator *)__return_storage_ptr__;
  sVar1 = indent(this);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,sVar1,' ',&local_41);
  if ((this->m_suffix & 1U) == 0) {
    ::std::__cxx11::string::string((string *)&local_78,(string *)local_20);
  }
  else {
    ::std::operator+(&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,
                     "-");
  }
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __return_storage_ptr__,&local_40,&local_78);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return __return_storage_ptr__;
}

Assistant:

auto addIndentAndSuffix(std::string const &plain) const -> std::string {
			return std::string(indent(), ' ') + (m_suffix ? plain + "-" : plain);
		}